

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

Gia_StaAre_t * Gia_ManAreCreateStaNew(Gia_ManAre_t *p)

{
  uint **ppuVar1;
  Gia_Man_t *p_00;
  int iVar2;
  uint *puVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iVar6;
  Gia_StaAre_t *pGVar7;
  uint uVar8;
  
  uVar8 = p->nStas;
  iVar5 = p->nStaPages;
  if (uVar8 == iVar5 << 0x14) {
    if (iVar5 == 0x800) {
      puts("ERA manager has run out of memory after allocating 2B state cubes.");
      pGVar7 = (Gia_StaAre_t *)0x0;
      goto LAB_00591cf7;
    }
    ppuVar1 = p->ppStas;
    if (ppuVar1[iVar5] == (uint *)0x0) {
      puVar3 = (uint *)calloc((long)p->nSize << 0x14,4);
      ppuVar1[iVar5] = puVar3;
    }
    p->nStaPages = iVar5 + 1;
    uVar8 = uVar8 + (uVar8 == 0);
  }
  p->nStas = uVar8 + 1;
  pGVar7 = (Gia_StaAre_t *)
           ((long)p->nSize * (ulong)(uVar8 & 0xfffff) * 4 +
           *(long *)((long)p->ppStas + (ulong)(uVar8 >> 0x11 & 0x3ff8)));
LAB_00591cf7:
  iVar5 = 0;
  iVar6 = 0;
  do {
    p_00 = p->pAig;
    if (p_00->nRegs <= iVar6) {
      return pGVar7;
    }
    pGVar4 = Gia_ManCo(p_00,(p_00->vCos->nSize - p_00->nRegs) + iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      return pGVar7;
    }
    iVar2 = 1;
    if (pGVar4->Value == 0) {
LAB_00591d37:
      (&pGVar7[1].iPrev)[iVar5 >> 5] =
           (Gia_PtrAre_t)((uint)(&pGVar7[1].iPrev)[iVar5 >> 5] | iVar2 << ((byte)iVar5 & 0x1e));
    }
    else if (pGVar4->Value == 1) {
      iVar2 = 2;
      goto LAB_00591d37;
    }
    iVar6 = iVar6 + 1;
    iVar5 = iVar5 + 2;
  } while( true );
}

Assistant:

static inline Gia_StaAre_t * Gia_ManAreCreateStaNew( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i;
    pSta = Gia_ManAreCreateSta( p );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( pObj->Value == 0 )
            Gia_StaSetValue0( pSta, i );
        else if ( pObj->Value == 1 )
            Gia_StaSetValue1( pSta, i );
    }
    return pSta;
}